

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DatatypeValidator::serialize(DatatypeValidator *this,XSerializeEngine *serEng)

{
  DatatypeValidator *pDVar1;
  RegularExpression *this_00;
  XMLCh *toWrite;
  XMLSize_t dummyBufferLen;
  XMLSize_t dummyDataLen;
  XMLCh *typeUri;
  XMLCh *typeLocalName_1;
  XMLCh *typeLocalName;
  int flag;
  int type;
  ArrayJanitor<char16_t> AStack_58;
  ArrayJanitor<char16_t> local_48;
  char16_t *local_38;
  char16_t *local_30;
  char16_t *local_28;
  int local_20;
  ORDERING local_1c;
  
  if (serEng->fStoreLoad == 0) {
    XSerializeEngine::operator<<(serEng,this->fAnonymous);
    XSerializeEngine::operator<<(serEng,this->fFinite);
    XSerializeEngine::operator<<(serEng,this->fBounded);
    XSerializeEngine::operator<<(serEng,this->fNumeric);
    XSerializeEngine::operator<<(serEng,this->fWhiteSpace);
    XSerializeEngine::operator<<(serEng,this->fFinalSet);
    XSerializeEngine::operator<<(serEng,this->fFacetsDefined);
    XSerializeEngine::operator<<(serEng,this->fFixed);
    XSerializeEngine::operator<<(serEng,this->fType);
    XSerializeEngine::operator<<(serEng,this->fOrdered);
    storeDV(serEng,this->fBaseValidator);
    XTemplateSerializer::storeObject(this->fFacets,serEng);
    XSerializeEngine::writeString(serEng,this->fPattern,0,false);
    if (this->fTypeUri != L"") {
      if (this->fTypeUri == L"http://www.w3.org/2001/XMLSchema") {
        XSerializeEngine::operator<<(serEng,-2);
        toWrite = this->fTypeLocalName;
      }
      else {
        XSerializeEngine::operator<<(serEng,-3);
        XSerializeEngine::writeString(serEng,this->fTypeLocalName,0,false);
        toWrite = this->fTypeUri;
      }
      XSerializeEngine::writeString(serEng,toWrite,0,false);
      return;
    }
    XSerializeEngine::operator<<(serEng,-1);
    return;
  }
  XSerializeEngine::operator>>(serEng,&this->fAnonymous);
  XSerializeEngine::operator>>(serEng,&this->fFinite);
  XSerializeEngine::operator>>(serEng,&this->fBounded);
  XSerializeEngine::operator>>(serEng,&this->fNumeric);
  XSerializeEngine::operator>>(serEng,&this->fWhiteSpace);
  XSerializeEngine::operator>>(serEng,&this->fFinalSet);
  XSerializeEngine::operator>>(serEng,&this->fFacetsDefined);
  XSerializeEngine::operator>>(serEng,&this->fFixed);
  XSerializeEngine::operator>>(serEng,(int *)&local_1c);
  this->fType = local_1c;
  XSerializeEngine::operator>>(serEng,(int *)&local_1c);
  this->fOrdered = local_1c;
  pDVar1 = loadDV(serEng);
  this->fBaseValidator = pDVar1;
  XTemplateSerializer::loadObject(&this->fFacets,0x1d,true,serEng);
  XSerializeEngine::readString
            (serEng,&this->fPattern,(XMLSize_t *)&AStack_58,(XMLSize_t *)&local_48,false);
  XSerializeEngine::operator>>(serEng,&local_20);
  if (local_20 == -2) {
    XSerializeEngine::readString
              (serEng,&local_28,(XMLSize_t *)&AStack_58,(XMLSize_t *)&local_48,false);
    ArrayJanitor<char16_t>::ArrayJanitor(&AStack_58,local_28,this->fMemoryManager);
    setTypeName(this,local_28);
  }
  else {
    if (local_20 == -1) {
      if (this->fTypeName != (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])();
        this->fTypeName = (XMLCh *)0x0;
      }
      this->fTypeLocalName = L"";
      this->fTypeUri = L"";
      goto LAB_002fc1a4;
    }
    XSerializeEngine::readString
              (serEng,&local_30,(XMLSize_t *)&AStack_58,(XMLSize_t *)&local_48,false);
    ArrayJanitor<char16_t>::ArrayJanitor(&AStack_58,local_30,this->fMemoryManager);
    XSerializeEngine::readString
              (serEng,&local_38,(XMLSize_t *)&local_48,(XMLSize_t *)&local_28,false);
    ArrayJanitor<char16_t>::ArrayJanitor(&local_48,local_38,this->fMemoryManager);
    setTypeName(this,local_30,local_38);
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_48);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_58);
LAB_002fc1a4:
  this_00 = (RegularExpression *)XMemory::operator_new(0x70,this->fMemoryManager);
  RegularExpression::RegularExpression(this_00,this->fPattern,L"X",this->fMemoryManager);
  this->fRegex = this_00;
  return;
}

Assistant:

void DatatypeValidator::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fAnonymous;
        serEng<<fFinite;
        serEng<<fBounded;
        serEng<<fNumeric;

        serEng<<fWhiteSpace;
        serEng<<fFinalSet;
        serEng<<fFacetsDefined;
        serEng<<fFixed;

        serEng<<(int)fType;
        serEng<<(int)fOrdered;

        storeDV(serEng, fBaseValidator);

        /***
         *  Serialize RefHashTableOf<KVStringPair>
         ***/
        XTemplateSerializer::storeObject(fFacets, serEng);

        serEng.writeString(fPattern);

        if (fTypeUri==XMLUni::fgZeroLenString)
        {
            serEng<<TYPENAME_ZERO;
        }
        else if (fTypeUri == SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
        {
            serEng<<TYPENAME_S4S;
            serEng.writeString(fTypeLocalName);
        }
        else
        {        
            serEng<<TYPENAME_NORMAL;
            serEng.writeString(fTypeLocalName);
            serEng.writeString(fTypeUri);
        }

        /***
         * don't serialize 
         *       fRegex
         ***/    
    }
    else
    {
        serEng>>fAnonymous;
        serEng>>fFinite;
        serEng>>fBounded;
        serEng>>fNumeric;

        serEng>>fWhiteSpace;
        serEng>>fFinalSet;
        serEng>>fFacetsDefined;
        serEng>>fFixed;

        int type;
        serEng>>type;
        fType=(ValidatorType)type;

        serEng>>type;
        fOrdered = (XSSimpleTypeDefinition::ORDERING)type;


        fBaseValidator = loadDV(serEng);

        /***
         *
         *  Deserialize RefHashTableOf<KVStringPair>
         *
         ***/
        XTemplateSerializer::loadObject(&fFacets, 29, true, serEng);
        serEng.readString(fPattern);       

        /***
         *   Recreate through setTypeName()
         *       fTypeName
         ***/

        int flag;
        serEng>>flag;

        if ( TYPENAME_ZERO == flag )
        {
            setTypeName(0);
        }
        else if ( TYPENAME_S4S == flag )
        {
            XMLCh* typeLocalName;
            serEng.readString(typeLocalName);
            ArrayJanitor<XMLCh> janName(typeLocalName, fMemoryManager);

            setTypeName(typeLocalName);
        }
        else // TYPENAME_NORMAL
        {
            XMLCh* typeLocalName;
            serEng.readString(typeLocalName);
            ArrayJanitor<XMLCh> janName(typeLocalName, fMemoryManager);

            XMLCh* typeUri;
            serEng.readString(typeUri);
            ArrayJanitor<XMLCh> janUri(typeUri, fMemoryManager);

            setTypeName(typeLocalName, typeUri);
        }

        /***
         * don't serialize fRegex
         ***/
        fRegex = new (fMemoryManager) RegularExpression(fPattern, SchemaSymbols::fgRegEx_XOption, fMemoryManager);

    }

}